

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O2

void __thiscall Blip_Buffer::bass_freq(Blip_Buffer *this,int freq)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  
  this->bass_freq_ = freq;
  if (freq == 0) {
    iVar1 = 0x1f;
  }
  else {
    dVar4 = log(((double)this->samples_per_sec * 0.124) / (double)freq);
    dVar4 = floor(dVar4 * 1.442695041);
    iVar2 = (int)dVar4;
    iVar3 = 0x17;
    if (iVar2 < 0x17) {
      iVar3 = iVar2;
    }
    iVar1 = 0;
    if (-2 < iVar2) {
      iVar1 = iVar3 + 1;
    }
  }
  this->bass_shift = iVar1;
  return;
}

Assistant:

void Blip_Buffer::bass_freq( int freq )
{
	bass_freq_ = freq;
	if ( freq == 0 ) {
		bass_shift = 31; // 32 or greater invokes undefined behavior elsewhere
		return;
	}
	bass_shift = 1 + (int) floor( 1.442695041 * log( 0.124 * samples_per_sec / freq ) );
	if ( bass_shift < 0 )
		bass_shift = 0;
	if ( bass_shift > 24 )
		bass_shift = 24;
}